

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Expr * __thiscall Parser::multiplicative_expression(Parser *this)

{
  uint uVar1;
  int iVar2;
  Expr *pEVar3;
  ulong uVar4;
  pointer pTVar5;
  Expr *pEVar6;
  ulong uVar7;
  Token *pTVar8;
  bool bVar9;
  
  pEVar3 = primary_expression(this);
  if (pEVar3 == (Expr *)0x0) {
    pEVar3 = (Expr *)0x0;
  }
  else {
    pTVar8 = this->tok;
    bVar9 = pTVar8->kind == Punctuator;
    if (bVar9) {
      pEVar6 = pEVar3;
      do {
        if (pTVar8->i != 0x2a) {
          if (!bVar9) {
            return pEVar6;
          }
          if (pTVar8->i != 0x2f) {
            if (!bVar9) {
              return pEVar6;
            }
            if (pTVar8->i != 0x25) {
              return pEVar6;
            }
          }
        }
        pEVar3 = (Expr *)operator_new(0x20);
        (pEVar3->super_Node).kind = BinExpr;
        (pEVar3->super_Node)._vptr_Node = (_func_int **)&PTR__BinExpr_00117cf8;
        (pEVar3->super_Node).field_0xc = (char)pTVar8->i;
        pEVar3[1].super_Node._vptr_Node = (_func_int **)pEVar6;
        iVar2 = this->tok_i;
        uVar1 = iVar2 + 1;
        this->tok_i = uVar1;
        pTVar5 = &this->eof;
        if (-2 < iVar2) {
          uVar4 = (ulong)uVar1;
          pTVar5 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 2) *
                  -0x3333333333333333;
          pTVar5 = pTVar5 + uVar4;
          if (uVar7 < uVar4 || uVar7 - uVar4 == 0) {
            pTVar5 = &this->eof;
          }
        }
        this->tok = pTVar5;
        pEVar6 = primary_expression(this);
        *(Expr **)&pEVar3[1].super_Node.kind = pEVar6;
        if (pEVar6 == (Expr *)0x0) {
          error<char_const(&)[30],char&>
                    (this,(char (*) [30])"expecting expression after %c",
                     &(pEVar3->super_Node).field_0xc);
        }
        pTVar8 = this->tok;
        bVar9 = pTVar8->kind == Punctuator;
        pEVar6 = pEVar3;
      } while (bVar9);
    }
  }
  return pEVar3;
}

Assistant:

Expr* Parser::multiplicative_expression()
{
  std::unique_ptr<Expr> e(primary_expression());
  if (!e)
    return nullptr;

  while (is_punctuator('*') ||
         is_punctuator('/') ||
         is_punctuator('%')) {
    auto be = std::make_unique<BinExpr>();
    be->op = tok->i;
    be->lhs = e.release();

    next_token();
    be->rhs = primary_expression();
    if (!be->rhs)
      error("expecting expression after %c", be->op);

    e = std::move(be);
  }

  return e.release();
}